

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O2

int is_running_inside_a_container(void)

{
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  int iVar3;
  char *line;
  size_t len;
  
  line = (char *)0x0;
  len = 0;
  __stream = fopen("/proc/self/cgroup","r");
  if (__stream == (FILE *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
    do {
      _Var1 = getline(&line,&len,__stream);
      if (_Var1 == -1) {
        iVar3 = 0;
        break;
      }
      pcVar2 = strstr(line,"docker");
    } while (pcVar2 == (char *)0x0);
    fclose(__stream);
    free(line);
  }
  return iVar3;
}

Assistant:

static int is_running_inside_a_container(void)
{
#ifdef WIN32
    return 0;
#else
    const char *cgroup_filename = "/proc/self/cgroup";
    FILE *f;
    char *line = NULL;
    size_t len = 0;
    ssize_t read;
    int found = 0;
    f = fopen(cgroup_filename, "r");
    if(!f) {
        /* Don't go further, we are not in a container */
        return 0;
    }
    while((read = getline(&line, &len, f)) != -1) {
        if(strstr(line, "docker")) {
            found = 1;
            break;
        }
    }
    fclose(f);
    free(line);
    return found;
#endif
}